

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O2

void loop_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  cs_detail *pcVar1;
  ushort uVar2;
  uint uVar3;
  byte bVar4;
  long lVar5;
  uint uVar6;
  MCInst *MI_00;
  ushort uVar7;
  
  uVar7 = *address;
  uVar2 = uVar7 + 1;
  *address = uVar2;
  lVar5 = (ulong)uVar7 - (ulong)info->offset;
  uVar3 = info->size;
  if ((uint)lVar5 < uVar3) {
    uVar6 = (uint)info->code[lVar5];
  }
  else {
    uVar6 = 0;
  }
  bVar4 = (byte)uVar6;
  info->insn = loop_hdlr::index_to_insn_id[bVar4 >> 5];
  if (0xbf < bVar4) {
    MI_00 = _stderr;
    fprintf((FILE *)_stderr,"Internal error: Unexpected post byte in loop instruction %02X.\n",
            (ulong)uVar6);
    illegal_hdlr(MI_00,info,address);
    uVar2 = *address;
    uVar3 = info->size;
  }
  *address = uVar2 + 1;
  lVar5 = (ulong)uVar2 - (ulong)info->offset;
  if ((uint)lVar5 < uVar3) {
    uVar7 = (ushort)info->code[lVar5];
  }
  else {
    uVar7 = 0;
  }
  add_reg_operand(info,loop_hdlr::index_to_reg_id[bVar4 & 7]);
  bVar4 = (info->m680x).op_count;
  (info->m680x).op_count = bVar4 + 1;
  if ((uVar6 & 0x10) != 0) {
    uVar7 = uVar7 - 0x100;
  }
  (info->m680x).operands[bVar4].type = M680X_OP_RELATIVE;
  (info->m680x).operands[bVar4].field_1.rel.offset = uVar7;
  (info->m680x).operands[bVar4].field_1.rel.address = uVar7 + *address;
  pcVar1 = MI->flat_insn->detail;
  if (pcVar1 != (cs_detail *)0x0) {
    bVar4 = pcVar1->groups_count;
    pcVar1->groups_count = bVar4 + 1;
    pcVar1->groups[bVar4] = '\a';
  }
  return;
}

Assistant:

static void loop_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	static const m680x_reg index_to_reg_id[] = {
		M680X_REG_A, M680X_REG_B, M680X_REG_INVALID, M680X_REG_INVALID,
		M680X_REG_D, M680X_REG_X, M680X_REG_Y, M680X_REG_S,
	};
	static const m680x_insn index_to_insn_id[] = {
		M680X_INS_DBEQ, M680X_INS_DBNE, M680X_INS_TBEQ, M680X_INS_TBNE,
		M680X_INS_IBEQ, M680X_INS_IBNE, M680X_INS_ILLGL, M680X_INS_ILLGL
	};
	cs_m680x *m680x = &info->m680x;
	uint8_t post_byte = 0;
	uint8_t rel = 0;
	cs_m680x_op *op;

	read_byte(info, &post_byte, (*address)++);

	info->insn = index_to_insn_id[(post_byte >> 5) & 0x07];

	if (info->insn == M680X_INS_ILLGL) {
		fprintf(stderr, "Internal error: Unexpected post byte "
			"in loop instruction %02X.\n", post_byte);
		illegal_hdlr(MI, info, address);
	};

	read_byte(info, &rel, (*address)++);

	add_reg_operand(info, index_to_reg_id[post_byte & 0x07]);

	op = &m680x->operands[m680x->op_count++];

	op->type = M680X_OP_RELATIVE;

	op->rel.offset = (post_byte & 0x10) ? 0xff00 | rel : rel;

	op->rel.address = *address + op->rel.offset;

	add_insn_group(MI->flat_insn->detail, M680X_GRP_BRAREL);
}